

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

SimpleString __thiscall MemoryAccountant::report(MemoryAccountant *this)

{
  size_t extraout_RDX;
  long *in_RSI;
  MemoryAccountant *in_RDI;
  SimpleString SVar2;
  MemoryAccountantAllocationNode *node;
  SimpleString accountantReport;
  MemoryAccountant *in_stack_ffffffffffffff58;
  MemoryAccountant *this_00;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *in_stack_ffffffffffffff88;
  char local_68 [16];
  long local_58;
  size_t sVar1;
  
  if (*in_RSI == 0) {
    SVar2 = reportNoAllocations(in_stack_ffffffffffffff58);
    sVar1 = SVar2.bufferSize_;
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    reportTitle(in_RDI);
    reportHeader(this_00);
    SimpleString::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    SimpleString::~SimpleString((SimpleString *)0x11251e);
    SimpleString::~SimpleString((SimpleString *)0x112528);
    for (local_58 = *in_RSI; local_58 != 0; local_58 = *(long *)(local_58 + 0x28)) {
      stringSize(this_00,(size_t)in_RDI);
      in_stack_ffffffffffffff58 =
           (MemoryAccountant *)SimpleString::asCharString((SimpleString *)0x112564);
      StringFromFormat(local_68,"%s               %5d            %5d             %5d\n",
                       in_stack_ffffffffffffff58,(ulong)*(uint *)(local_58 + 8),
                       (ulong)*(uint *)(local_58 + 0x10),(ulong)*(uint *)(local_58 + 0x18));
      SimpleString::operator+=((SimpleString *)in_RDI,(SimpleString *)in_stack_ffffffffffffff58);
      SimpleString::~SimpleString((SimpleString *)0x1125b1);
      SimpleString::~SimpleString((SimpleString *)0x1125bb);
    }
    reportFooter(in_stack_ffffffffffffff58);
    SimpleString::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    SimpleString::~SimpleString((SimpleString *)0x112680);
    SimpleString::~SimpleString((SimpleString *)0x11268d);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this_00;
  return SVar2;
}

Assistant:

SimpleString MemoryAccountant::report() const
{
    if (head_ == NULLPTR)
      return reportNoAllocations();

    SimpleString accountantReport = reportTitle() + reportHeader();

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
        accountantReport += StringFromFormat(MEMORY_ACCOUNTANT_ROW_FORMAT, stringSize(node->size_).asCharString(), (int) node->allocations_, (int) node->deallocations_, (int) node->maxAllocations_);

    return accountantReport + reportFooter();
}